

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polyhedron_algorithms.cpp
# Opt level: O3

void __thiscall sch::Polyhedron_algorithms::updateFastArrays(Polyhedron_algorithms *this)

{
  S_PolyhedronVertex **ppSVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (this->fastVertexes_ != (S_PolyhedronVertex **)0x0) {
    operator_delete__(this->fastVertexes_);
  }
  uVar2 = (long)(this->vertexes_).
                super__Vector_base<sch::S_PolyhedronVertex_*,_std::allocator<sch::S_PolyhedronVertex_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->vertexes_).
                super__Vector_base<sch::S_PolyhedronVertex_*,_std::allocator<sch::S_PolyhedronVertex_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = uVar2 >> 3;
  this->numberOfVertices_ = (uint)uVar3;
  if ((uint)uVar3 == 0) {
    this->fastVertexes_ = (S_PolyhedronVertex **)0x0;
    this->lastVertexes_ = (S_PolyhedronVertex **)0x0;
  }
  else {
    ppSVar1 = (S_PolyhedronVertex **)operator_new__(uVar2 & 0x7fffffff8);
    this->fastVertexes_ = ppSVar1;
    uVar2 = 0;
    do {
      this->fastVertexes_[uVar2] =
           (this->vertexes_).
           super__Vector_base<sch::S_PolyhedronVertex_*,_std::allocator<sch::S_PolyhedronVertex_*>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar2];
      uVar2 = uVar2 + 1;
    } while ((uVar3 & 0xffffffff) != uVar2);
    this->lastVertexes_ = this->fastVertexes_ + (uVar3 & 0xffffffff);
  }
  return;
}

Assistant:

void Polyhedron_algorithms::updateFastArrays()
{
  if(fastVertexes_ != NULL)
  {
    delete[] fastVertexes_;
  }
  numberOfVertices_ = unsigned(vertexes_.size());
  if(numberOfVertices_ > 0)
  {
    fastVertexes_ = new S_PolyhedronVertex *[numberOfVertices_];
    for(unsigned int i = 0; i < numberOfVertices_; ++i)
    {
      fastVertexes_[i] = vertexes_[i];
    }

    lastVertexes_ = &(fastVertexes_[numberOfVertices_]);
  }
  else
  {
    fastVertexes_ = lastVertexes_ = NULL;
  }
}